

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindPlatformMonitorForPos(ImVec2 *pos)

{
  bool bVar1;
  ImGuiPlatformMonitor *lhs;
  ImVec2 local_48;
  ImRect local_40;
  ImGuiPlatformMonitor *local_30;
  ImGuiPlatformMonitor *monitor;
  ImGuiContext_conflict *pIStack_20;
  int monitor_n;
  ImGuiContext_conflict *g;
  ImVec2 *pos_local;
  
  pIStack_20 = GImGui;
  monitor._4_4_ = 0;
  g = (ImGuiContext_conflict *)pos;
  while( true ) {
    if ((pIStack_20->PlatformIO).Monitors.Size <= monitor._4_4_) {
      return -1;
    }
    lhs = ImVector<ImGuiPlatformMonitor>::operator[]
                    (&(pIStack_20->PlatformIO).Monitors,monitor._4_4_);
    local_30 = lhs;
    local_48 = operator+(&lhs->MainPos,&lhs->MainSize);
    ImRect::ImRect(&local_40,&lhs->MainPos,&local_48);
    bVar1 = ImRect::Contains(&local_40,(ImVec2 *)g);
    if (bVar1) break;
    monitor._4_4_ = monitor._4_4_ + 1;
  }
  return monitor._4_4_;
}

Assistant:

static int ImGui::FindPlatformMonitorForPos(const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    for (int monitor_n = 0; monitor_n < g.PlatformIO.Monitors.Size; monitor_n++)
    {
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[monitor_n];
        if (ImRect(monitor.MainPos, monitor.MainPos + monitor.MainSize).Contains(pos))
            return monitor_n;
    }
    return -1;
}